

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

void __thiscall IR::Opnd::Dump(Opnd *this,IRDumpFlags flags,Func *func)

{
  byte bVar1;
  Type TVar2;
  Opnd *this_00;
  Opnd *this_01;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  AddrOpndKind addressKind;
  uint uVar6;
  PropertyId propertyId;
  JITTypeHolderBase<void> *description;
  ValueType *pVVar7;
  undefined4 *puVar8;
  PropertySymOpnd *this_02;
  ArrayRegOpnd *this_03;
  StackSym *pSVar9;
  void *address;
  PropertySym *pPVar10;
  JITType *this_04;
  intptr_t iVar11;
  ObjTypeSpecFldInfo *this_05;
  PropertyRecord *pPVar12;
  Type_conflict pBVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  char16_t *pcVar17;
  char16_t *pcVar18;
  char16 *pcVar19;
  ListOpnd *list;
  char16_t *pcVar20;
  char16_t *pcVar21;
  ThreadContext *this_06;
  ulong uVar22;
  bool bVar23;
  _func_int **pp_Var24;
  JITTypeHolderBase<void> local_168;
  char16 buffer [128];
  
  bVar23 = (flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None;
  switch(this->m_kind) {
  case OpndKindIntConst:
  case OpndKindInt64Const:
    EncodableOpnd<long>::DumpEncodable((EncodableOpnd<long> *)(this + 1));
    break;
  case OpndKindFloatConst:
    pp_Var24 = this[1]._vptr_Opnd;
    goto LAB_00621969;
  case OpndKindFloat32Const:
    pp_Var24 = (_func_int **)(double)*(float *)&this[1]._vptr_Opnd;
LAB_00621969:
    Output::Print(L"%G",pp_Var24);
    break;
  case OpndKindHelperCall:
    description = (JITTypeHolderBase<void> *)GetMethodName(*(JnHelperMethod *)&this[1]._vptr_Opnd);
    pcVar19 = L"%s";
    goto LAB_006219eb;
  case OpndKindSym:
    pVVar7 = (ValueType *)&this[1].m_kind;
    if (((Sym *)this[1]._vptr_Opnd)->m_kind != SymKindProperty) {
      pVVar7 = &ValueType::Uninitialized;
    }
    if ((flags & IRDumpFlags_SimpleForm) != IRDumpFlags_None) {
      pVVar7 = &ValueType::Uninitialized;
    }
    Sym::Dump((Sym *)this[1]._vptr_Opnd,flags,(ValueType)pVVar7->field_0);
    pp_Var24 = this[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var24 + 0x14) != '\x01') {
      bVar5 = SymOpnd::IsPropertySymOpnd((SymOpnd *)this);
      if (!bVar5 || (char)((flags & IRDumpFlags_SimpleForm) >> 1) != '\0') break;
      this_02 = AsPropertySymOpnd(this);
      Output::Print(L"<");
      if (this_02->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
        Output::Print(L"?,,");
      }
      else {
        uVar6 = PropertySymOpnd::GetObjTypeSpecFldId(this_02);
        if (this_02->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
          pcVar17 = L"m";
        }
        else {
          bVar5 = ObjTypeSpecFldInfo::IsPoly(this_02->objTypeSpecFldInfo);
          pcVar17 = L"m";
          if (bVar5) {
            pcVar17 = L"p";
          }
        }
        pcVar18 = L"";
        pcVar21 = L"";
        if (this_02->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) {
          bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_02->objTypeSpecFldInfo);
          pcVar21 = L"";
          if (bVar5) {
            pcVar21 = L"~";
          }
        }
        pcVar20 = L"=";
        if (((ushort)this_02->field_12 & 2) == 0) {
          pcVar20 = L"";
        }
        if (this_02->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) {
          bVar5 = ObjTypeSpecFldInfo::IsBeingAdded(this_02->objTypeSpecFldInfo);
          pcVar18 = L"";
          if (bVar5) {
            pcVar18 = L"+";
          }
        }
        Output::Print(L"%u,%s%s%s%s,",uVar6,pcVar17,pcVar21,pcVar20,pcVar18);
      }
      if ((this_02->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
         ((bVar5 = PropertySymOpnd::IsTypeCheckSeqCandidate(this_02), !bVar5 &&
          (((ushort)this_02->field_12 & 2) == 0)))) {
        if (this_02->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) {
          bVar5 = ObjTypeSpecFldInfo::IsRootObjectNonConfigurableFieldLoad
                            (this_02->objTypeSpecFldInfo);
          pcVar17 = L"Type not supported for unary ~";
          pcVar18 = L"-";
          goto LAB_00621f9c;
        }
        pcVar18 = L"-";
      }
      else if (this_02->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
        pcVar18 = L"=";
      }
      else {
        bVar5 = ObjTypeSpecFldInfo::IsMono(this_02->objTypeSpecFldInfo);
        pcVar17 = L"Type not supported for unary +";
        pcVar18 = L"=";
LAB_00621f9c:
        if (bVar5 != false) {
          pcVar18 = pcVar17 + 0x1d;
        }
      }
      bVar5 = PropertySymOpnd::IsTypeCheckSeqCandidate(this_02);
      pcVar21 = L"+";
      pcVar17 = L"Type not supported for unary -";
      if (bVar5) {
        pcVar17 = L"Type not supported for unary +";
      }
      Output::Print(L"%s%s,",pcVar18,pcVar17 + 0x1d);
      bVar5 = PropertySymOpnd::HasObjectTypeSym(this_02);
      if (bVar5) {
        pSVar9 = PropertySymOpnd::GetObjectTypeSym(this_02);
        Output::Print(L"s%d",(ulong)(pSVar9->super_Sym).m_id);
        if (((this_02->field_12).objTypeSpecFlags & 0x800) == 0) {
          if (((this_02->field_12).objTypeSpecFlags & 0x200) != 0) {
            Output::Print(L"*");
          }
        }
        else {
          if (this_02->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
            pcVar17 = L"p";
          }
          else {
            bVar5 = ObjTypeSpecFldInfo::IsMono(this_02->objTypeSpecFldInfo);
            pcVar17 = L"p";
            if (bVar5) {
              pcVar17 = L"m";
            }
          }
          Output::Print(L"+%s",pcVar17);
        }
        if (((this_02->field_12).field_0.field_5.typeCheckSeqFlags & 4) != 0) {
          pcVar19 = L"!";
          goto LAB_00622089;
        }
      }
      else {
        pcVar19 = L"s?";
LAB_00622089:
        Output::Print(pcVar19);
      }
      pPVar10 = Sym::AsPropertySym((this_02->super_SymOpnd).m_sym);
      if (pPVar10->m_writeGuardSym == (PropertySym *)0x0) {
        pcVar21 = L",s?";
LAB_006220d1:
        Output::Print(pcVar21);
      }
      else {
        pPVar10 = Sym::AsPropertySym((this_02->super_SymOpnd).m_sym);
        Output::Print(L",s%d",(ulong)(pPVar10->m_writeGuardSym->super_Sym).m_id);
        if (((this_02->field_12).field_0.field_5.typeCheckSeqFlags & 0x40) != 0) goto LAB_006220d1;
      }
      local_168.t = (Type)0x0;
      bVar5 = JITTypeHolderBase<void>::operator!=(&this_02->finalType,&local_168.t);
      if (bVar5) {
        Output::Print(L",final:");
        local_168.t = (this_02->finalType).t;
        this_04 = JITTypeHolderBase<void>::operator->(&local_168);
        iVar11 = JITType::GetAddr(this_04);
        if (DAT_015b0198 == '\0') {
          Output::Print(L"0xXXXXXXXX");
        }
        else {
          Output::Print(L"0x%012I64X",iVar11);
        }
      }
      if (this_02->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        Output::Print(L",{");
        if (func == (Func *)0x0) {
          Output::Print(L"(no func)");
        }
        else {
          pBVar13 = this_02->guardedPropOps->head;
          if (pBVar13 != (Type_conflict)0x0) {
            iVar15 = 0;
            do {
              uVar22 = (pBVar13->data).word;
              buffer._248_8_ = pBVar13;
              if (uVar22 != 0) {
                TVar2 = pBVar13->startIndex;
                uVar16 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                do {
                  BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar16);
                  if (0 < iVar15) {
                    Output::Print(L",");
                  }
                  uVar14 = TVar2 + (BVIndex)uVar16;
                  this_05 = Func::GetGlobalObjTypeSpecFldInfo(func->topFunc,uVar14);
                  this_06 = (ThreadContext *)func->m_threadContextInfo;
                  if (this_06 != (ThreadContext *)0x0) {
                    this_06 = (ThreadContext *)&this_06[-1].entryPointToBuiltInOperationIdCache.size
                    ;
                  }
                  propertyId = ObjTypeSpecFldInfo::GetPropertyId(this_05);
                  pPVar12 = ThreadContext::GetPropertyRecord(this_06,propertyId);
                  Output::Print(L"%s",pPVar12 + 1,(ulong)uVar14);
                  Output::Print(L"(%u)",(ulong)uVar14);
                  bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_05);
                  if (bVar5) {
                    Output::Print(L"~");
                  }
                  bVar5 = ObjTypeSpecFldInfo::HasFixedValue(this_05);
                  if (bVar5) {
                    Output::Print(L"=");
                  }
                  bVar5 = ObjTypeSpecFldInfo::IsBeingAdded(this_05);
                  if (bVar5) {
                    Output::Print(L"+");
                  }
                  uVar22 = uVar22 & ~(1L << (uVar16 & 0x3f));
                  lVar3 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                    }
                  }
                  uVar16 = (ulong)(-(uint)(uVar22 == 0) | (uint)lVar3);
                  iVar15 = iVar15 + 1;
                } while (uVar22 != 0);
              }
              pBVar13 = *(Type_conflict *)buffer._248_8_;
            } while (pBVar13 != (Type_conflict)0x0);
          }
        }
        Output::Print(L"}");
      }
      if (this_02->writeGuards != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        Output::Print(L",{");
        pBVar13 = this_02->writeGuards->head;
        if (pBVar13 != (Type_conflict)0x0) {
          iVar15 = 0;
          do {
            uVar22 = (pBVar13->data).word;
            if (uVar22 != 0) {
              TVar2 = pBVar13->startIndex;
              uVar16 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              do {
                BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar16);
                if (0 < iVar15) {
                  Output::Print(L",");
                }
                uVar22 = uVar22 & ~(1L << (uVar16 & 0x3f));
                Output::Print(L"s%d",(ulong)((BVIndex)uVar16 + TVar2));
                lVar3 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                uVar16 = (ulong)(-(uint)(uVar22 == 0) | (uint)lVar3);
                iVar15 = iVar15 + 1;
              } while (uVar22 != 0);
            }
            pBVar13 = pBVar13->next;
          } while (pBVar13 != (Type)0x0);
        }
        Output::Print(L"}");
      }
      if (((this_02->super_SymOpnd).super_Opnd.field_0xb & 0x10) != 0) {
        Output::Print(L",t");
      }
      pcVar19 = L">";
      goto LAB_00621e2f;
    }
    if (((*(byte *)((long)pp_Var24 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var24 + 0x16) == 0)
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar5) goto LAB_006223b3;
      *puVar8 = 0;
    }
    if ((*(uint *)(pp_Var24 + 3) >> 0x14 & 1) == 0) {
      bVar5 = *(int *)(pp_Var24 + 4) != 0;
LAB_00621d05:
      if (!bVar5) break;
    }
    else if (*(int *)(pp_Var24 + 4) == -1) {
      bVar5 = (*(uint *)(pp_Var24 + 3) >> 0xe & 1) == 0;
      goto LAB_00621d05;
    }
    uVar14 = *(uint *)(pp_Var24 + 4);
    if (*(int *)&this[1].m_valueType != 0) {
      if ((int)(*(int *)&this[1].m_valueType + uVar14) < (int)uVar14) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                           ,0xc60,"(static_cast<int>(offset + symOpnd->m_offset) >= offset)",
                           "static_cast<int>(offset + symOpnd->m_offset) >= offset");
        if (!bVar5) {
LAB_006223b3:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
      uVar14 = uVar14 + *(int *)&this[1].m_valueType;
    }
    pcVar17 = L"<%d>";
    goto LAB_00621d81;
  case OpndKindReg:
    if ((Sym *)this[1]._vptr_Opnd != (Sym *)0x0) {
      Sym::Dump((Sym *)this[1]._vptr_Opnd,flags,(ValueType)0x9);
    }
    uVar22 = (ulong)*(byte *)((long)&this[1].m_valueType.field_0.bits + 1);
    if ((flags & IRDumpFlags_AsmDumpMode) == IRDumpFlags_None) {
      if (uVar22 != 0) {
        Output::Print(L"(%S)",RegNames[uVar22]);
      }
      if (((ushort)this[1].m_valueType.field_0 & 1) != 0) {
        Output::Print(L"[isTempLastUse]");
      }
      bVar5 = RegOpnd::IsArrayRegOpnd((RegOpnd *)this);
      if (!bVar5) break;
      if ((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) {
        DumpValueType(this);
      }
      bVar23 = false;
      this_03 = RegOpnd::AsArrayRegOpnd((RegOpnd *)this);
      if (this_03->headSegmentSym != (StackSym *)0x0) {
        Output::Print(L"[seg: ");
        Sym::Dump(&this_03->headSegmentSym->super_Sym,(ValueType)0x9);
        Output::Print(L"]");
      }
      if (this_03->headSegmentLengthSym != (StackSym *)0x0) {
        Output::Print(L"[segLen: ");
        Sym::Dump(&this_03->headSegmentLengthSym->super_Sym,(ValueType)0x9);
        Output::Print(L"]");
      }
      pSVar9 = ArrayRegOpnd::LengthSym(this_03);
      if ((pSVar9 != (StackSym *)0x0) &&
         (pSVar9 = ArrayRegOpnd::LengthSym(this_03), pSVar9 != this_03->headSegmentLengthSym)) {
        Output::Print(L"[len: ");
        pSVar9 = ArrayRegOpnd::LengthSym(this_03);
        Sym::Dump(&pSVar9->super_Sym,(ValueType)0x9);
        Output::Print(L"]");
      }
      if ((this_03->eliminatedLowerBoundCheck == false) &&
         (this_03->eliminatedUpperBoundCheck != true)) break;
      Output::Print(L"[");
      if (this_03->eliminatedLowerBoundCheck == true) {
        Output::Print(L">");
      }
      if (this_03->eliminatedUpperBoundCheck == true) {
        pcVar19 = L"<";
        goto LAB_00621e21;
      }
      goto LAB_00621e28;
    }
    description = (JITTypeHolderBase<void> *)RegNames[uVar22];
    pcVar19 = L"%S";
    goto LAB_006219eb;
  case OpndKindAddr:
    description = &local_168;
    GetAddrDescription(this,(char16 *)description,0x80,(bool)((byte)flags & 1),true,func);
    pcVar19 = L"%s";
LAB_006219eb:
    Output::Print(pcVar19,description);
    break;
  case OpndKindIndir:
    this_00 = (Opnd *)this[1]._vptr_Opnd;
    this_01 = *(Opnd **)&this[1].m_valueType;
    uVar14 = *(uint *)&this[2]._vptr_Opnd;
    Output::Print(L"[");
    if (this_00 == (Opnd *)0x0) {
      Output::Print(L"<null>");
    }
    else {
      Dump(this_00,flags,func);
    }
    if (this_01 != (Opnd *)0x0) {
      Output::Print(L"+");
      Dump(this_01,flags,func);
      bVar1 = *(byte *)((long)&this[2]._vptr_Opnd + 4);
      if (bVar1 != 0) {
        Output::Print(L"*%d",(ulong)(uint)(1 << (bVar1 & 0x1f)));
      }
    }
    if (uVar14 != 0) {
      if ((DAT_015b0198 == '\0') && (*(char *)&this[3].m_valueType.field_0 != -1)) {
        Output::Print(L"+XX");
      }
      else {
        pcVar17 = L"";
        if (-1 < (int)uVar14) {
          pcVar17 = L"+";
        }
        if ((flags & IRDumpFlags_AsmDumpMode) == IRDumpFlags_None) {
          pcVar18 = L"%s%d";
        }
        else {
          uVar14 = uVar14 & 0xffff;
          pcVar18 = L"%sXXXX%04d";
        }
        Output::Print(pcVar18,pcVar17,(ulong)uVar14);
      }
    }
    if (this[3]._vptr_Opnd != (_func_int **)0x0) {
      Output::Print(L" <%s>");
    }
    if (*(char *)&this[3].m_valueType.field_0 != -1) {
      address = IndirOpnd::GetOriginalAddress((IndirOpnd *)this);
      Output::Print(L" <");
      addressKind = IndirOpnd::GetAddrKind((IndirOpnd *)this);
      GetAddrDescription((char16 *)&local_168,0x80,address,addressKind,false,true,func,true);
      Output::Print(L"%s",&local_168);
      pcVar19 = L">";
LAB_00621e21:
      Output::Print(pcVar19);
    }
LAB_00621e28:
    pcVar19 = L"]";
LAB_00621e2f:
    Output::Print(pcVar19);
    break;
  case OpndKindLabel:
    if (this[1]._vptr_Opnd == (_func_int **)0x0) {
      pcVar19 = L"??";
      goto LAB_00621e2f;
    }
    uVar14 = *(uint *)((long)this[1]._vptr_Opnd + 0x7c);
    pcVar17 = L"&$L%d";
LAB_00621d81:
    Output::Print(pcVar17,(ulong)uVar14);
    break;
  case OpndKindMemRef:
    DumpOpndKindMemRef(this,false,func);
    break;
  case OpndKindRegBV:
    BVUnitT<unsigned_long>::Dump((BVUnitT<unsigned_long> *)(this + 1),0,false);
    break;
  case OpndKindList:
    Output::Print(L"{");
    iVar15 = *(int *)&this[1]._vptr_Opnd;
    if (0 < (long)iVar15) {
      uVar22 = 0;
      do {
        Dump(*(Opnd **)(*(long *)&this[1].m_valueType + uVar22 * 8),flags,func);
        uVar22 = uVar22 + 1;
        if (uVar22 < (ulong)(long)iVar15) {
          Output::Print(L",");
        }
      } while ((long)uVar22 < (long)*(int *)&this[1]._vptr_Opnd);
    }
    Output::Print(L"}");
  }
  if (((flags & IRDumpFlags_AsmDumpMode) == IRDumpFlags_None) && (bVar23)) {
    DumpValueType(this);
  }
  if (((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) || (this->m_type != TyVar)) {
    Output::Print(L".");
    IRType_Dump(this->m_type);
  }
  if (((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) && ((this->field_0xb & 4) != 0)) {
    Output::Print(L"!");
  }
  return;
}

Assistant:

void
Opnd::Dump(IRDumpFlags flags, Func *func)
{
    bool const AsmDumpMode = flags & IRDumpFlags_AsmDumpMode;
    bool const SimpleForm = !!(flags & IRDumpFlags_SimpleForm);
    FloatConstType floatValue;
    SymOpnd * symOpnd;
    RegOpnd * regOpnd;
    JnHelperMethod helperMethod;
    bool dumpValueType = !SimpleForm;

    switch(GetKind())
    {
    case OpndKindSym:
        symOpnd = this->AsSymOpnd();
        if(symOpnd->m_sym->IsPropertySym() && !SimpleForm)
        {
            symOpnd->m_sym->Dump(flags, symOpnd->GetPropertyOwnerValueType());
        }
        else
        {
            symOpnd->m_sym->Dump(flags);
        }

        if (symOpnd->m_sym->IsStackSym())
        {
            StackSym * stackSym = symOpnd->m_sym->AsStackSym();
            bool hasOffset = stackSym->IsArgSlotSym()?
                ((stackSym->m_offset != -1) || !stackSym->m_isInlinedArgSlot) :
                (stackSym->m_offset != 0);
            if (hasOffset)
            {
                int offset = stackSym->m_offset;
                if(symOpnd->m_offset != 0)
                {
                    Assert(static_cast<int>(offset + symOpnd->m_offset) >= offset);
                    offset += symOpnd->m_offset;
                }
                Output::Print(_u("<%d>"), offset);
            }
        }
        else if (symOpnd->IsPropertySymOpnd() && !SimpleForm)
        {
            PropertySymOpnd *propertySymOpnd = symOpnd->AsPropertySymOpnd();
            Output::Print(_u("<"));
            if (propertySymOpnd->HasObjTypeSpecFldInfo())
            {
                Output::Print(_u("%u,%s%s%s%s,"), propertySymOpnd->GetObjTypeSpecFldId(), propertySymOpnd->IsPoly() ? _u("p") : _u("m"),
                    propertySymOpnd->IsLoadedFromProto() ? _u("~") : _u(""), propertySymOpnd->UsesFixedValue() ? _u("=") : _u(""),
                    propertySymOpnd->IsBeingAdded() ? _u("+") : _u(""));
            }
            else
            {
                Output::Print(_u("?,,"));
            }
            Output::Print(_u("%s%s,"), propertySymOpnd->MayNeedTypeCheckProtection() ?
                propertySymOpnd->IsMono() ? _u("+") : _u("=") :
                propertySymOpnd->IsRootObjectNonConfigurableFieldLoad() ? _u("~") : _u("-"),
                propertySymOpnd->IsTypeCheckSeqCandidate() ? _u("+") : _u("-"));
            if (propertySymOpnd->HasObjectTypeSym())
            {
                Output::Print(_u("s%d"), propertySymOpnd->GetObjectTypeSym()->m_id);
                if (propertySymOpnd->IsTypeChecked())
                {
                    Output::Print(_u("+%s"), propertySymOpnd->IsMono() ? _u("m") : _u("p"));
                }
                else if (propertySymOpnd->IsTypeAvailable())
                {
                    Output::Print(_u("*"));
                }
                if (propertySymOpnd->IsTypeDead())
                {
                    Output::Print(_u("!"));
                }
            }
            else
            {
                Output::Print(_u("s?"));
            }
            if (propertySymOpnd->m_sym->AsPropertySym()->m_writeGuardSym != nullptr)
            {
                Output::Print(_u(",s%d"), propertySymOpnd->m_sym->AsPropertySym()->m_writeGuardSym->m_id);
                if (propertySymOpnd->IsWriteGuardChecked())
                {
                    Output::Print(_u("+"));
                }
            }
            else
            {
                Output::Print(_u(",s?"));
            }
            if (propertySymOpnd->HasFinalType())
            {
                Output::Print(_u(",final:"));
                this->DumpAddress((void*)propertySymOpnd->GetFinalType()->GetAddr(), /* printToConsole */ true, /* skipMaskedAddress */ false);
            }
            if (propertySymOpnd->GetGuardedPropOps() != nullptr)
            {
                Output::Print(_u(",{"));
                if (func != nullptr)
                {
                    int i = 0;
                    auto guardedPropOps = propertySymOpnd->GetGuardedPropOps();
                    FOREACH_BITSET_IN_SPARSEBV(propertyOpId, guardedPropOps)
                    {
                        if (i++ > 0)
                        {
                            Output::Print(_u(","));
                        }
                        const ObjTypeSpecFldInfo* propertyOpInfo = func->GetTopFunc()->GetGlobalObjTypeSpecFldInfo(propertyOpId);
                        if (!JITManager::GetJITManager()->IsOOPJITEnabled())
                        {
                            Output::Print(_u("%s"), func->GetInProcThreadContext()->GetPropertyRecord(propertyOpInfo->GetPropertyId())->GetBuffer(), propertyOpId);
                        }
                        Output::Print(_u("(%u)"), propertyOpId);

                        if (propertyOpInfo->IsLoadedFromProto())
                        {
                            Output::Print(_u("~"));
                        }
                        if (propertyOpInfo->HasFixedValue())
                        {
                            Output::Print(_u("="));
                        }
                        if (propertyOpInfo->IsBeingAdded())
                        {
                            Output::Print(_u("+"));
                        }
                    }
                    NEXT_BITSET_IN_SPARSEBV;
                }
                else
                {
                    Output::Print(_u("(no func)"));
                }
                Output::Print(_u("}"));
            }
            if (propertySymOpnd->GetWriteGuards() != nullptr)
            {
                Output::Print(_u(",{"));
                int i = 0;
                auto writeGuards = propertySymOpnd->GetWriteGuards();
                FOREACH_BITSET_IN_SPARSEBV(writeGuardSymId, writeGuards)
                {
                    if (i++ > 0)
                    {
                        Output::Print(_u(","));
                    }
                    Output::Print(_u("s%d"), writeGuardSymId);
                }
                NEXT_BITSET_IN_SPARSEBV;
                Output::Print(_u("}"));
            }
            if (propertySymOpnd->canStoreTemp)
            {
                Output::Print(_u(",t"));
            }
            Output::Print(_u(">"));
        }

        break;

    case OpndKindReg:
        regOpnd = this->AsRegOpnd();
        if (regOpnd->m_sym)
        {
            regOpnd->m_sym->Dump(flags);
        }
        if(AsmDumpMode)
        {
            //
            // Print no brackets
            //
            Output::Print(_u("%S"), RegNames[regOpnd->GetReg()]);
        }
        else
        {
            if (regOpnd->GetReg() != RegNOREG)
            {
                Output::Print(_u("(%S)"), RegNames[regOpnd->GetReg()]);
            }
            if (regOpnd->m_isTempLastUse)
            {
                Output::Print(_u("[isTempLastUse]"));
            }

            if(regOpnd->IsArrayRegOpnd())
            {
                if(dumpValueType)
                {
                    // Dump the array value type before the associated syms
                    DumpValueType();
                    dumpValueType = false;
                }

                const ArrayRegOpnd *const arrayRegOpnd = regOpnd->AsArrayRegOpnd();
                if(arrayRegOpnd->HeadSegmentSym())
                {
                    Output::Print(_u("[seg: "));
                    arrayRegOpnd->HeadSegmentSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->HeadSegmentLengthSym())
                {
                    Output::Print(_u("[segLen: "));
                    arrayRegOpnd->HeadSegmentLengthSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->LengthSym() && arrayRegOpnd->LengthSym() != arrayRegOpnd->HeadSegmentLengthSym())
                {
                    Output::Print(_u("[len: "));
                    arrayRegOpnd->LengthSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->EliminatedLowerBoundCheck() || arrayRegOpnd->EliminatedUpperBoundCheck())
                {
                    Output::Print(_u("["));
                    if(arrayRegOpnd->EliminatedLowerBoundCheck())
                    {
                        Output::Print(_u(">"));
                    }
                    if(arrayRegOpnd->EliminatedUpperBoundCheck())
                    {
                        Output::Print(_u("<"));
                    }
                    Output::Print(_u("]"));
                }
            }
        }
        break;

    case OpndKindInt64Const:
    {
        Int64ConstOpnd * intConstOpnd = this->AsInt64ConstOpnd();
        intConstOpnd->DumpEncodable();
        break;
    }
    case OpndKindIntConst:
    {
        IntConstOpnd * intConstOpnd = this->AsIntConstOpnd();
        intConstOpnd->DumpEncodable();
        break;
    }

    case OpndKindRegBV:
    {
        RegBVOpnd * regBVOpnd = this->AsRegBVOpnd();
        regBVOpnd->m_value.Dump();
        break;
    }

    case OpndKindHelperCall:
        helperMethod = this->AsHelperCallOpnd()->m_fnHelper;
        Output::Print(_u("%s"), IR::GetMethodName(helperMethod));
        break;

    case OpndKindFloatConst:
        floatValue = this->AsFloatConstOpnd()->m_value;
        Output::Print(_u("%G"), floatValue);
        break;

    case OpndKindFloat32Const:
        Output::Print(_u("%G"), this->AsFloat32ConstOpnd()->m_value);
        break;

    case OpndKindAddr:
        DumpOpndKindAddr(AsmDumpMode, func);
        break;

    case OpndKindIndir:
    {
        IndirOpnd * indirOpnd = this->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
        const int32 offset = indirOpnd->GetOffset();

        Output::Print(_u("["));
        if (baseOpnd != nullptr)
        {
            baseOpnd->Dump(flags, func);
        }
        else
        {
            Output::Print(_u("<null>"));
        }

        if (indexOpnd != nullptr)
        {
            Output::Print(_u("+"));
            indexOpnd->Dump(flags, func);
            if (indirOpnd->GetScale() > 0)
            {
                Output::Print(_u("*%d"), 1 << indirOpnd->GetScale());
            }
        }
        if (offset != 0)
        {
            if (!Js::Configuration::Global.flags.DumpIRAddresses && indirOpnd->HasAddrKind())
            {
                Output::Print(_u("+XX"));
            }
            else
            {
                const auto sign = offset >= 0 ? _u("+") : _u("");
                if (AsmDumpMode)
                {
                    Output::Print(_u("%sXXXX%04d"), sign, offset & 0xffff);
                }
                else
                {
                    Output::Print(_u("%s%d"), sign, offset);
                }
            }
        }
        if (indirOpnd->GetDescription())
        {
            Output::Print(_u(" <%s>"), indirOpnd->GetDescription());
        }
        if (indirOpnd->HasAddrKind())
        {
            INT_PTR address = (INT_PTR)indirOpnd->GetOriginalAddress();
            Output::Print(_u(" <"));
            const size_t BUFFER_LEN = 128;
            char16 buffer[BUFFER_LEN];
            GetAddrDescription(buffer, BUFFER_LEN, (void *)address, indirOpnd->GetAddrKind(), AsmDumpMode, /*printToConsole */ true, func, /* skipMaskedAddress */true);
            Output::Print(_u("%s"), buffer);
            Output::Print(_u(">"));
        }

        Output::Print(_u("]"));
        break;
    }
    case IR::OpndKindList:
    {
        IR::ListOpnd* list = this->AsListOpnd();
        Output::Print(_u("{"));
        int count = list->Count();
        list->Map([flags, func, count](int i, IR::Opnd* opnd)
        {
            opnd->Dump(flags, func);
            if (i + 1 < count)
            {
                Output::Print(_u(","));
            }
        });
        Output::Print(_u("}"));
        break;
    }
    case OpndKindMemRef:
    {
        DumpOpndKindMemRef(AsmDumpMode, func);
        break;
    }
    case OpndKindLabel:
    {
        LabelOpnd * labelOpnd = this->AsLabelOpnd();
        LabelInstr * labelInstr = labelOpnd->GetLabel();
        if (labelInstr == nullptr)
        {
            Output::Print(_u("??"));
        }
        else
        {
            Output::Print(_u("&$L%d"), labelInstr->m_id);
        }
        break;
    }
    }

    if(!AsmDumpMode && dumpValueType)
    {
        DumpValueType();
    }
    if (!SimpleForm || this->GetType() != TyVar)
    {
        Output::Print(_u("."));
        IRType_Dump(this->GetType());
    }
    if (this->m_isDead && !SimpleForm)
    {
        Output::Print(_u("!"));
    }
}